

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O2

char * bssl::anon_unknown_0::GetVersionName(uint16_t version)

{
  undefined2 in_register_0000003a;
  
  switch(CONCAT22(in_register_0000003a,version)) {
  case 0x301:
    return "TLSv1";
  case 0x302:
    return "TLSv1.1";
  case 0x303:
    return "TLSv1.2";
  case 0x304:
    return "TLSv1.3";
  }
  if (CONCAT22(in_register_0000003a,version) == 0xfefc) {
    return "DTLSv1.3";
  }
  if (CONCAT22(in_register_0000003a,version) == 0xfefd) {
    return "DTLSv1.2";
  }
  if (CONCAT22(in_register_0000003a,version) != 0xfeff) {
    return "???";
  }
  return "DTLSv1";
}

Assistant:

static const char *GetVersionName(uint16_t version) {
  switch (version) {
    case TLS1_VERSION:
      return "TLSv1";
    case TLS1_1_VERSION:
      return "TLSv1.1";
    case TLS1_2_VERSION:
      return "TLSv1.2";
    case TLS1_3_VERSION:
      return "TLSv1.3";
    case DTLS1_VERSION:
      return "DTLSv1";
    case DTLS1_2_VERSION:
      return "DTLSv1.2";
    case DTLS1_3_VERSION:
      return "DTLSv1.3";
    default:
      return "???";
  }
}